

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O2

expected<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* tinyusdz::usda::EnumHandler<tinyusdz::APISchemas::APIName>
            (expected<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *prop_name,string *tok,
            vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
            *enums)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  error_type *peVar4;
  pointer ppVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v;
  long lVar6;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  ulong uVar8;
  allocator local_181;
  expected<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string *local_158;
  string s;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toks;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((enums->
      super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (enums->
      super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    uVar8 = 0xffffffffffffffff;
LAB_00133dbd:
    ppVar3 = (enums->
             super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (enums->
             super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    uVar8 = uVar8 + 1;
    if (uVar8 < (ulong)((long)ppVar5 - (long)ppVar3 >> 4)) goto code_r0x00133ddc;
    toks.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    toks.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    toks.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar6 = 8;
    local_180 = __return_storage_ptr__;
    local_158 = prop_name;
    for (pvVar7 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0;
        v = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)ppVar5 - (long)ppVar3 >> 4), pvVar7 < v;
        pvVar7 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&(pvVar7->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1)) {
      ::std::__cxx11::string::string
                ((string *)&ret,*(char **)((long)&ppVar3->first + lVar6),(allocator *)&s);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&toks,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
      ::std::__cxx11::string::_M_dispose();
      ppVar3 = (enums->
               super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppVar5 = (enums->
               super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar6 = lVar6 + 0x10;
    }
    ::std::__cxx11::string::string((string *)&ret,", ",(allocator *)&local_b0);
    ::std::__cxx11::string::string((string *)&local_178,"\"",(allocator *)&local_d0);
    quote((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_108,&toks,(string *)&local_178);
    join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&s,(tinyusdz *)&ret,(string *)&local_108,v);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_108);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::operator+(&local_90,"Allowed tokens are [",&s);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,
                     "] but got ");
    ::std::__cxx11::string::string((string *)&local_50,"\"",&local_181);
    quote(&local_70,tok,&local_50);
    ::std::operator+(&local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70)
    ;
    ::std::operator+(&local_108,&local_b0,".");
    __return_storage_ptr__ = local_180;
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p == &local_108.field_2) {
      local_178.field_2._8_8_ = local_108.field_2._8_8_;
    }
    else {
      local_178._M_dataplus._M_p = local_108._M_dataplus._M_p;
    }
    local_178.field_2._M_allocated_capacity._1_7_ = local_108.field_2._M_allocated_capacity._1_7_;
    local_178.field_2._M_local_buf[0] = local_108.field_2._M_local_buf[0];
    local_178._M_string_length = local_108._M_string_length;
    local_108._M_string_length = 0;
    local_108.field_2._M_local_buf[0] = '\0';
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&ret,(unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_178);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&toks);
    prop_name = local_158;
    if ((ret.contained.
         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .m_has_value & 1U) != 0) goto LAB_00133dfa;
    peVar4 = nonstd::expected_lite::
             expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::error(&ret);
    ::std::__cxx11::string::string((string *)&s,(string *)peVar4);
    nonstd::expected_lite::
    expected<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (__return_storage_ptr__,
               (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&s);
    goto LAB_001341e0;
  }
LAB_00133df0:
  ret.contained.
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .m_has_value = true;
  ret.contained.
  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .field_0.m_value = true;
LAB_00133dfa:
  ppVar3 = (enums->
           super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (enums->
           super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar3 == ppVar5) {
      ::std::__cxx11::string::string((string *)&local_90,"\"",(allocator *)&local_70);
      quote(&local_d0,tok,&local_90);
      ::std::operator+(&local_b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_d0," is an invalid token for attribute `");
      ::std::operator+(&local_108,&local_b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       prop_name);
      ::std::operator+(&local_178,&local_108,"`");
      s._M_dataplus._M_p = (pointer)&s.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p == &local_178.field_2) {
        s.field_2._8_8_ = local_178.field_2._8_8_;
      }
      else {
        s._M_dataplus._M_p = local_178._M_dataplus._M_p;
      }
      s._M_string_length = local_178._M_string_length;
      local_178._M_string_length = 0;
      local_178.field_2._M_allocated_capacity =
           local_178.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      nonstd::expected_lite::
      expected<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (__return_storage_ptr__,
                 (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&s);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
LAB_001341e0:
      ::std::__cxx11::string::_M_dispose();
LAB_001341e5:
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
      return __return_storage_ptr__;
    }
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              tok,ppVar3->second);
    if (bVar1) {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value = ppVar3->first;
      goto LAB_001341e5;
    }
    ppVar3 = ppVar3 + 1;
  } while( true );
code_r0x00133ddc:
  iVar2 = ::std::__cxx11::string::compare((char *)tok);
  if (iVar2 == 0) goto LAB_00133df0;
  goto LAB_00133dbd;
}

Assistant:

nonstd::expected<T, std::string> EnumHandler(
    const std::string &prop_name, const std::string &tok,
    const std::vector<std::pair<T, const char *>> &enums) {
  auto ret = CheckAllowedTokens<T>(enums, tok);
  if (!ret) {
    return nonstd::make_unexpected(ret.error());
  }

  for (auto &item : enums) {
    if (tok == item.second) {
      return item.first;
    }
  }
  // Should never reach here, though.
  return nonstd::make_unexpected(
      quote(tok) + " is an invalid token for attribute `" + prop_name + "`");
}